

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TACBuilderVisitor.cpp
# Opt level: O1

void __thiscall hdc::TACBuilderVisitor::visit(TACBuilderVisitor *this,MinusExpression *expression)

{
  int src1;
  int src2;
  int dst;
  Expression *pEVar1;
  
  pEVar1 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  src1 = this->lastTemporary;
  pEVar1 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  src2 = this->lastTemporary;
  dst = this->tempCounter;
  this->lastTemporary = dst;
  this->tempCounter = dst + 1;
  emit(this,TAC_SUB,dst,src1,src2);
  return;
}

Assistant:

void TACBuilderVisitor::visit(MinusExpression* expression) {
    int src1;
    int src2;
    int dst;

    expression->getLeft()->accept(this);
    src1 = lastTemporary;

    expression->getRight()->accept(this);
    src2 = lastTemporary;

    dst = newTemporary();
    emit(TAC_SUB, dst, src1, src2);
}